

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.cpp
# Opt level: O0

int main(void)

{
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
  *__s;
  inline_timer *piVar1;
  reference pvVar2;
  ostream *poVar3;
  inline_timer *in_stack_00000018;
  ostream *in_stack_00000020;
  int i;
  value_type *in_stack_fffffffffffffe08;
  inline_timer *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe20;
  allocator<char> *line;
  string *in_stack_fffffffffffffe28;
  string *file;
  inline_timer *in_stack_fffffffffffffe30;
  allocator<char> *in_stack_fffffffffffffe40;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  int local_1a4;
  duration<long,std::ratio<1l,1000l>> local_1a0 [8];
  int local_198;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [140];
  int local_dc;
  undefined1 local_d8 [16];
  string local_c8 [55];
  undefined1 local_91 [141];
  undefined4 local_4;
  
  local_4 = 0;
  __s = perf::inline_timer_stack();
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_fffffffffffffe40);
  __a = (allocator<char> *)(local_d8 + 0xf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  perf::inline_timer::inline_timer
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  push((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
        *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  perf::inline_timer::~inline_timer(in_stack_fffffffffffffe10);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0xf));
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x10361c);
  perf::inline_timer::start(in_stack_fffffffffffffe10);
  local_dc = 0x14;
  file = (string *)local_d8;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)file,&local_dc);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)__a);
  piVar1 = (inline_timer *)perf::inline_timer_stack();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  line = &local_191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  perf::inline_timer::inline_timer(piVar1,file,(size_t)line,in_stack_fffffffffffffe18);
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  push((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
        *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  perf::inline_timer::~inline_timer(in_stack_fffffffffffffe10);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x10372e);
  perf::inline_timer::start(in_stack_fffffffffffffe10);
  for (local_198 = 0; local_198 < 10; local_198 = local_198 + 1) {
    local_1a4 = 0x14;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_1a0,&local_1a4);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)__a);
  }
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x1038b6);
  perf::inline_timer::stop(in_stack_fffffffffffffe10);
  perf::inline_timer_stack();
  pvVar2 = std::
           stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
           ::top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
                  *)0x1038cb);
  perf::inline_timer::set_last_line(pvVar2,0x2b);
  piVar1 = (inline_timer *)perf::inline_out_ptr();
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x1038ef);
  poVar3 = perf::operator<<(in_stack_00000020,in_stack_00000018);
  std::operator<<(poVar3,'\n');
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  pop((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x103916);
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x103923);
  perf::inline_timer::stop(piVar1);
  perf::inline_timer_stack();
  pvVar2 = std::
           stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
           ::top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
                  *)0x103938);
  perf::inline_timer::set_last_line(pvVar2,0x2d);
  perf::inline_out_ptr();
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  top((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x10395c);
  poVar3 = perf::operator<<(in_stack_00000020,in_stack_00000018);
  std::operator<<(poVar3,'\n');
  perf::inline_timer_stack();
  std::
  stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>::
  pop((stack<perf::inline_timer,_std::deque<perf::inline_timer,_std::allocator<perf::inline_timer>_>_>
       *)0x103983);
  return 0;
}

Assistant:

int main()
{
    PERF_START();
    std::this_thread::sleep_for(perf::milliseconds(20));

    PERF_START();
    for (int i = 0; i < 10; i++)
    {
        std::this_thread::sleep_for(perf::milliseconds(20));
    }
    PERF_STOP();

    PERF_STOP();

    return 0;
}